

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O0

Error __thiscall
asmjit::CodeCompiler::_newConst(CodeCompiler *this,Mem *out,uint32_t scope,void *data,size_t size)

{
  undefined4 uVar1;
  Error EVar2;
  CBConstPool *pCVar3;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  int in_R8D;
  Error err;
  size_t off;
  CBConstPool *pool;
  CBConstPool **pPool;
  uint32_t signature;
  char *in_stack_fffffffffffffee8;
  Error in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 local_100;
  CodeBuilder *in_stack_ffffffffffffff08;
  long lVar4;
  long *local_f0;
  Error local_bc;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  
  if (in_EDX == 0) {
    local_f0 = (long *)(in_RDI + 0x1c8);
  }
  else {
    if (in_EDX != 1) {
      EVar2 = CodeEmitter::setLastError
                        ((CodeEmitter *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
      return EVar2;
    }
    local_f0 = (long *)(in_RDI + 0x1d0);
  }
  if (*local_f0 == 0) {
    pCVar3 = CodeBuilder::newConstPool(in_stack_ffffffffffffff08);
    *local_f0 = (long)pCVar3;
    if (pCVar3 == (CBConstPool *)0x0) {
      EVar2 = CodeEmitter::setLastError
                        ((CodeEmitter *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
      return EVar2;
    }
  }
  lVar4 = *local_f0;
  EVar2 = ConstPool::add((ConstPool *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (size_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (EVar2 == 0) {
    uVar1 = *(undefined4 *)(lVar4 + 0x28);
    *in_RSI = CONCAT44(0xffffffff,in_R8D << 0x18 | 10);
    in_RSI[1] = CONCAT44(uVar1,local_100);
    local_bc = 0;
  }
  else {
    local_bc = CodeEmitter::setLastError
                         ((CodeEmitter *)CONCAT44(EVar2,in_stack_fffffffffffffef8),
                          in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
  }
  return local_bc;
}

Assistant:

Error CodeCompiler::_newConst(Mem& out, uint32_t scope, const void* data, size_t size) {
  CBConstPool** pPool;
  if (scope == kConstScopeLocal)
    pPool = &_localConstPool;
  else if (scope == kConstScopeGlobal)
    pPool = &_globalConstPool;
  else
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  if (!*pPool && !(*pPool = newConstPool()))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  CBConstPool* pool = *pPool;
  size_t off;

  Error err = pool->add(data, size, off);
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  out = Mem(Init,
    Label::kLabelTag,             // Base type.
    pool->getId(),                // Base id.
    0,                            // Index type.
    kInvalidValue,                // Index id.
    static_cast<int32_t>(off),    // Offset.
    static_cast<uint32_t>(size),  // Size.
    0);                           // Flags.
  return kErrorOk;
}